

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

void __thiscall
gl4cts::CopyImage::SmokeTest::getPixels
          (SmokeTest *this,GLuint name,testCase *test_case,GLubyte *out_pixels)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  GLenum GVar4;
  GLenum GVar5;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  GVar4 = test_case->m_target;
  if (GVar4 == 0x8d41) {
    GVar4 = 0xde1;
    GVar5 = 0xde1;
  }
  else {
    GVar5 = GVar4;
    if (GVar4 == 0x8513) {
      GVar5 = 0x8515;
    }
  }
  (**(code **)(lVar3 + 0xb8))(GVar4,name);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                  ,0xfa4);
  (**(code **)(lVar3 + 0xaa0))(GVar5,0,test_case->m_format,test_case->m_type,out_pixels);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"GetTexImage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                  ,0xfa7);
  (**(code **)(lVar3 + 0xb8))(GVar4,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                  ,0xfaa);
  return;
}

Assistant:

void SmokeTest::getPixels(GLuint name, const SmokeTest::testCase& test_case, GLubyte* out_pixels) const
{
	const Functions& gl		  = m_context.getRenderContext().getFunctions();
	GLenum			 tgt_bind = test_case.m_target;
	GLenum			 tgt_get  = test_case.m_target;

	if (GL_RENDERBUFFER == test_case.m_target)
	{
		tgt_bind = GL_TEXTURE_2D;
		tgt_get  = GL_TEXTURE_2D;
	}
	else if (GL_TEXTURE_CUBE_MAP == test_case.m_target)
	{
		tgt_get = GL_TEXTURE_CUBE_MAP_POSITIVE_X;
	}

	gl.bindTexture(tgt_bind, name);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	gl.getTexImage(tgt_get, 0 /* level */, test_case.m_format, test_case.m_type, out_pixels);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexImage");

	gl.bindTexture(tgt_bind, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");
}